

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

void Gia_LutDelayTraceSortPins(Gia_Man_t *p,int iObj,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *__assertion;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  iVar1 = Gia_ObjIsLut(p,iObj);
  if (iVar1 == 0) {
    __assertion = "Gia_ObjIsLut(p, iObj)";
    uVar7 = 0x31;
  }
  else {
    for (lVar5 = 0; iVar1 = Gia_ObjLutSize(p,iObj), lVar5 < iVar1; lVar5 = lVar5 + 1) {
      piVar4 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar4[lVar5];
      pPinPerm[lVar5] = (int)lVar5;
      fVar10 = Gia_ObjTimeArrival(p,iVar1);
      pPinDelays[lVar5] = fVar10;
    }
    lVar5 = 1;
    for (uVar9 = 0; iVar1 = Gia_ObjLutSize(p,iObj), lVar6 = lVar5, uVar8 = uVar9,
        (long)uVar9 < (long)(iVar1 + -1); uVar9 = uVar9 + 1) {
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,iObj);
        uVar7 = (uint)uVar8;
        if (iVar1 <= (int)(uint)lVar6) break;
        uVar2 = (uint)lVar6;
        if (pPinDelays[pPinPerm[lVar6]] < pPinDelays[pPinPerm[(int)uVar7]] ||
            pPinDelays[pPinPerm[lVar6]] == pPinDelays[pPinPerm[(int)uVar7]]) {
          uVar2 = uVar7;
        }
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)uVar2;
      }
      if (uVar9 != (uVar8 & 0xffffffff)) {
        iVar1 = pPinPerm[uVar9];
        pPinPerm[uVar9] = pPinPerm[(int)uVar7];
        pPinPerm[(int)uVar7] = iVar1;
      }
      lVar5 = lVar5 + 1;
    }
    iVar1 = Gia_ObjLutSize(p,iObj);
    if ((iVar1 == 0) || (iVar1 = *pPinPerm, iVar3 = Gia_ObjLutSize(p,iObj), iVar1 < iVar3)) {
      lVar5 = 1;
      do {
        iVar1 = Gia_ObjLutSize(p,iObj);
        if (iVar1 <= lVar5) {
          return;
        }
        iVar1 = pPinPerm[lVar5];
        iVar3 = Gia_ObjLutSize(p,iObj);
        if (iVar3 <= iVar1) {
          __assertion = "pPinPerm[i] < Gia_ObjLutSize(p, iObj)";
          uVar7 = 0x4a;
          goto LAB_0020464a;
        }
        lVar6 = lVar5 + -1;
        piVar4 = pPinPerm + lVar5;
        lVar5 = lVar5 + 1;
      } while (pPinDelays[*piVar4] <= pPinDelays[pPinPerm[lVar6]]);
      __assertion = "pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]";
      uVar7 = 0x4b;
    }
    else {
      __assertion = "Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj)";
      uVar7 = 0x47;
    }
  }
LAB_0020464a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                ,uVar7,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_LutDelayTraceSortPins( Gia_Man_t * p, int iObj, int * pPinPerm, float * pPinDelays )
{
    int iFanin, i, j, best_i, temp;
    assert( Gia_ObjIsLut(p, iObj) );
    // start the trivial permutation and collect pin delays
    Gia_LutForEachFanin( p, iObj, iFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Gia_ObjTimeArrival(p, iFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Gia_ObjLutSize(p, iObj)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Gia_ObjLutSize(p, iObj); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj) );
    for ( i = 1; i < Gia_ObjLutSize(p, iObj); i++ )
    {
        assert( pPinPerm[i] < Gia_ObjLutSize(p, iObj) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}